

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::Builtins::registerQueryFuncs(Builtins *this)

{
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  bool local_cc [4];
  shared_ptr<slang::ast::SystemSubroutine> local_c8;
  shared_ptr<slang::ast::SystemSubroutine> local_b8;
  shared_ptr<slang::ast::SystemSubroutine> local_a8;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  shared_ptr<slang::ast::SystemSubroutine> local_38;
  shared_ptr<slang::ast::SystemSubroutine> local_28;
  
  std::make_shared<slang::ast::builtins::BitsFunction>();
  local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  std::make_shared<slang::ast::builtins::TypenameFunction>();
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  std::make_shared<slang::ast::builtins::IsUnboundedFunction>();
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  std::make_shared<slang::ast::builtins::LowFunction>();
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  std::make_shared<slang::ast::builtins::HighFunction>();
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  std::make_shared<slang::ast::builtins::LeftFunction>();
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  std::make_shared<slang::ast::builtins::RightFunction>();
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  std::make_shared<slang::ast::builtins::SizeFunction>();
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  std::make_shared<slang::ast::builtins::IncrementFunction>();
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  std::
  make_shared<slang::ast::builtins::ArrayDimensionFunction,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)&local_e8,local_cc);
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  local_cc[0] = true;
  local_cc[1] = false;
  local_cc[2] = false;
  local_cc[3] = false;
  std::
  make_shared<slang::ast::builtins::ArrayDimensionFunction,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)&local_e8,local_cc);
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_e8;
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_e0[0]._M_pi;
  local_e8 = (element_type *)0x0;
  a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_e0);
  return;
}

Assistant:

void Builtins::registerQueryFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(name) addSystemSubroutine(std::make_shared<name##Function>())
    REGISTER(Bits);
    REGISTER(Typename);
    REGISTER(IsUnbounded);
    REGISTER(Low);
    REGISTER(High);
    REGISTER(Left);
    REGISTER(Right);
    REGISTER(Size);
    REGISTER(Increment);
#undef REGISTER

    addSystemSubroutine(
        std::make_shared<ArrayDimensionFunction>(KnownSystemName::Dimensions, false));
    addSystemSubroutine(
        std::make_shared<ArrayDimensionFunction>(KnownSystemName::UnpackedDimensions, true));
}